

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

bool __thiscall AbstractModuleClient::unsubToTimestamps(AbstractModuleClient *this)

{
  network_pimpl *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (this->super_MlmWrap).state;
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  network_pimpl::setTimestamp_endpoint(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this->lastTimestamp = 0;
  if (this->timestampsub != (zsock_t *)0x0) {
    zsock_destroy_checked
              (&this->timestampsub,
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/AbstractModuleClient.cpp"
               ,0x222);
    std::__cxx11::string::assign((char *)&this->timestampaddress);
  }
  return true;
}

Assistant:

bool AbstractModuleClient::unsubToTimestamps(){
    state->setTimestamp_endpoint("");
    lastTimestamp = 0;
    if(timestampsub){
        zsock_destroy(&timestampsub);
        timestampaddress = "";
        return true;
    }
    return true;
}